

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

MatchType __thiscall TileData::tryMatching(TileData *this,TileData *other)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  MatchType MVar4;
  ulong uVar5;
  bool bVar6;
  
  bVar3 = std::operator==(&this->_data,&other->_data);
  if (bVar3) {
    MVar4 = EXACT;
  }
  else if (options.allowMirroring == true) {
    bVar3 = std::
            equal<unsigned_char_const*,unsigned_char_const*,TileData::tryMatching(TileData_const&)const::_lambda(unsigned_char,unsigned_char)_1_>
                      (this,&this->_hash,other);
    if (bVar3) {
      MVar4 = HFLIP;
    }
    else {
      bVar3 = true;
      bVar6 = true;
      for (uVar5 = 0xf; uVar5 != 0xffffffffffffffff; uVar5 = uVar5 - 1) {
        bVar1 = (this->_data)._M_elems[0];
        bVar2 = (other->_data)._M_elems[uVar5 ^ 1];
        if (bVar1 != bVar2) {
          bVar6 = false;
        }
        if (bVar1 != flipTable._M_elems[bVar2]) {
          bVar3 = false;
        }
        if ((!bVar6) && (!bVar3)) goto LAB_00110e9d;
        this = (TileData *)((this->_data)._M_elems + 1);
      }
      if ((bVar6 == false) && (!bVar3)) {
        __assert_fail("hasVFlip || hasVHFlip",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                      ,0x2f6,"tryMatching");
      }
      MVar4 = VHFLIP - bVar6;
    }
  }
  else {
LAB_00110e9d:
    MVar4 = NOPE;
  }
  return MVar4;
}

Assistant:

MatchType tryMatching(TileData const &other) const {
		// Check for strict equality first, as that can typically be optimized, and it allows
		// hoisting the mirroring check out of the loop
		if (_data == other._data) {
			return MatchType::EXACT;
		}

		if (!options.allowMirroring) {
			return MatchType::NOPE;
		}

		// Check if we have horizontal mirroring, which scans the array forward again
		if (std::equal(_data.begin(), _data.end(), other._data.begin(),
		               [](uint8_t lhs, uint8_t rhs) { return lhs == flipTable[rhs]; })) {
			return MatchType::HFLIP;
		}

		// Check if we have vertical or vertical+horizontal mirroring, for which we have to read
		// bitplane *pairs*  backwards
		bool hasVFlip = true, hasVHFlip = true;
		for (uint8_t i = 0; i < _data.size(); ++i) {
			// Flip the bottom bit to get the corresponding row's bitplane 0/1
			// (This works because the array size is even)
			uint8_t lhs = _data[i], rhs = other._data[(15 - i) ^ 1];
			if (lhs != rhs) {
				hasVFlip = false;
			}
			if (lhs != flipTable[rhs]) {
				hasVHFlip = false;
			}
			if (!hasVFlip && !hasVHFlip) {
				return MatchType::NOPE; // If both have been eliminated, all hope is lost!
			}
		}

		// If we have both (i.e. we have symmetry), default to vflip only
		assert(hasVFlip || hasVHFlip);
		return hasVFlip ? MatchType::VFLIP : MatchType::VHFLIP;
	}